

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLScanner.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLScanner::checkIDRefs(XMLScanner *this)

{
  XMLValidator *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  XMLRefInfo *this_01;
  XMLCh *text1;
  XMLRefInfo *curRef;
  undefined1 local_40 [8];
  RefHashTableOfEnumerator<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> refEnum;
  XMLScanner *this_local;
  
  refEnum.fMemoryManager = (MemoryManager *)this;
  iVar2 = (*this->fValidationContext->_vptr_ValidationContext[2])();
  RefHashTableOfEnumerator<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher>::
  RefHashTableOfEnumerator
            ((RefHashTableOfEnumerator<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> *)
             local_40,(RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> *)
                      CONCAT44(extraout_var,iVar2),false,this->fMemoryManager);
  while (bVar1 = RefHashTableOfEnumerator<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher>::
                 hasMoreElements((RefHashTableOfEnumerator<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher>
                                  *)local_40), bVar1) {
    this_01 = RefHashTableOfEnumerator<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher>::
              nextElement((RefHashTableOfEnumerator<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher>
                           *)local_40);
    bVar1 = XMLRefInfo::getDeclared(this_01);
    if (((!bVar1) && (bVar1 = XMLRefInfo::getUsed(this_01), bVar1)) && ((this->fValidate & 1U) != 0)
       ) {
      this_00 = this->fValidator;
      text1 = XMLRefInfo::getRefName(this_01);
      XMLValidator::emitError(this_00,IDNotDeclared,text1,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
  }
  RefHashTableOfEnumerator<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher>::
  ~RefHashTableOfEnumerator
            ((RefHashTableOfEnumerator<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> *)
             local_40);
  return;
}

Assistant:

void XMLScanner::checkIDRefs()
{
    //  Iterate the id ref list. If we find any entries here which are used
    //  but not declared, then that's an error.
    RefHashTableOfEnumerator<XMLRefInfo> refEnum(fValidationContext->getIdRefList(), false, fMemoryManager);
    while (refEnum.hasMoreElements())
    {
        // Get a ref to the current element
        const XMLRefInfo& curRef = refEnum.nextElement();

        // If its used but not declared, then its an error
        if (!curRef.getDeclared() && curRef.getUsed() && fValidate)
            fValidator->emitError(XMLValid::IDNotDeclared, curRef.getRefName());
    }
}